

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucasemap_imp.h
# Opt level: O0

UBool icu_63::ustrcase_isLNS(UChar32 c)

{
  byte bVar1;
  int32_t iVar2;
  undefined1 local_16;
  undefined1 local_15;
  int gc;
  uint32_t LNS;
  UChar32 c_local;
  
  bVar1 = u_charType_63(c);
  local_15 = true;
  if ((1 << (bVar1 & 0x1f) & 0xf020e2eU) == 0) {
    local_16 = false;
    if (bVar1 == 4) {
      iVar2 = ucase_getType_63(c);
      local_16 = iVar2 != 0;
    }
    local_15 = local_16;
  }
  return local_15;
}

Assistant:

inline UBool ustrcase_isLNS(UChar32 c) {
    // Letter, number, symbol,
    // or a private use code point because those are typically used as letters or numbers.
    // Consider modifier letters only if they are cased.
    const uint32_t LNS = (U_GC_L_MASK|U_GC_N_MASK|U_GC_S_MASK|U_GC_CO_MASK) & ~U_GC_LM_MASK;
    int gc = u_charType(c);
    return (U_MASK(gc) & LNS) != 0 || (gc == U_MODIFIER_LETTER && ucase_getType(c) != UCASE_NONE);
}